

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O1

void __thiscall QTreeWidgetItem::executePendingSort(QTreeWidgetItem *this)

{
  int iVar1;
  SortOrder SVar2;
  QTreeModel *pQVar3;
  QTreeView *pQVar4;
  QHeaderView *pQVar5;
  
  pQVar3 = treeModel(this,(QTreeWidget *)0x0);
  if ((((pQVar3 != (QTreeModel *)0x0) && (pQVar3->skipPendingSort == false)) &&
      ((pQVar3->sortPendingTimer).m_id != Invalid)) &&
     (*(long *)(*(long *)&pQVar3->field_0x8 + 0x88) == 0)) {
    QBasicTimer::stop();
    pQVar4 = (QTreeView *)QMetaObject::cast((QObject *)&QTreeWidget::staticMetaObject);
    pQVar5 = QTreeView::header(pQVar4);
    iVar1 = QHeaderView::sortIndicatorSection(pQVar5);
    pQVar4 = (QTreeView *)QMetaObject::cast((QObject *)&QTreeWidget::staticMetaObject);
    pQVar5 = QTreeView::header(pQVar4);
    SVar2 = QHeaderView::sortIndicatorOrder(pQVar5);
    (**(code **)(*(long *)pQVar3 + 0x140))(pQVar3,iVar1,SVar2,*(code **)(*(long *)pQVar3 + 0x140));
    return;
  }
  return;
}

Assistant:

void QTreeWidgetItem::executePendingSort() const
{
    if (QTreeModel *model = treeModel())
        model->executePendingSort();
}